

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void __thiscall mpt::reference<mpt::layout::text>::type::type(type *this,uintptr_t initial)

{
  layout::text::text(&this->super_text,(text *)0x0);
  (this->super_text).super_metatype.super_convertable._vptr_convertable =
       (_func_int **)&PTR_convert_0014ebe0;
  (this->super_text).super_object._vptr_object = (_func_int **)&PTR_property_0014ec30;
  (this->_ref)._val = initial;
  return;
}

Assistant:

type(uintptr_t initial = 1) : _ref(initial)
		{ }